

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

Boxed_Value *
chaiscript::dispatch::detail::
call_func<chaiscript::dispatch::detail::Caller<chaiscript::Boxed_Value&,chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>,chaiscript::Boxed_Value&,chaiscript::Boxed_Value&,chaiscript::Boxed_Value_const&,0ul,1ul>
          (undefined8 param_1,undefined8 param_2,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *param_3,
          undefined8 param_4)

{
  Boxed_Value *pBVar1;
  Type_Conversions_State *in_stack_00000090;
  Boxed_Value *in_stack_00000098;
  Type_Conversions_State *in_stack_000000a0;
  Boxed_Value *in_stack_000000a8;
  Boxed_Value *in_stack_ffffffffffffffa8;
  Caller<chaiscript::Boxed_Value_&,_chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>
  *in_stack_ffffffffffffffb0;
  Boxed_Value local_40;
  Boxed_Value *local_30;
  undefined8 local_28;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_3,0);
  local_30 = (Boxed_Value *)
             boxed_cast<chaiscript::Boxed_Value&>(in_stack_000000a8,in_stack_000000a0);
  std::reference_wrapper::operator_cast_to_Boxed_Value_
            ((reference_wrapper<chaiscript::Boxed_Value> *)0x3825ac);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (local_20,1);
  pBVar1 = &local_40;
  boxed_cast<chaiscript::Boxed_Value_const&>(in_stack_00000098,in_stack_00000090);
  pBVar1 = Caller<chaiscript::Boxed_Value&,chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>::
           operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,pBVar1);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x3825fc);
  return pBVar1;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }